

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element_position_bitmask_table.hpp
# Opt level: O0

void __thiscall
burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,256ul>>::
initialize<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (element_position_bitmask_table<std::array<unsigned_short,256ul>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  bool bVar1;
  byte *pbVar2;
  reference pvVar3;
  unsigned_short local_2a;
  long lStack_28;
  bitmask_type position_indicator;
  size_t elements_count;
  element_position_bitmask_table<std::array<unsigned_short,_256UL>_> *this_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  lStack_28 = 0;
  local_2a = 1;
  this_local = (element_position_bitmask_table<std::array<unsigned_short,_256UL>_> *)last._M_current
  ;
  last_local._M_current = first._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&this_local);
    if (!bVar1) break;
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&last_local);
    pvVar3 = std::array<unsigned_short,_256UL>::operator[]
                       ((array<unsigned_short,_256UL> *)this,(ulong)*pbVar2);
    *pvVar3 = *pvVar3 | local_2a;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&last_local);
    local_2a = left_shift<unsigned_short,unsigned_int>(local_2a,1);
    lStack_28 = lStack_28 + 1;
  }
  *(long *)(this + 0x200) = lStack_28;
  return;
}

Assistant:

void initialize (InputIterator first, InputIterator last)
                {
                    using iterated_type = iterator_value_t<InputIterator>;
                    static_assert
                    (
                        std::is_integral<iterated_type>::value && sizeof(iterated_type) == 1,
                        "Входной элемент должен быть однобайтовым целым числом."
                    );

                    auto elements_count = std::size_t{0};

                    auto position_indicator = bitmask_type{0b1};
                    while (first != last)
                    {
                        m_bitmasks[static_cast<unsigned char>(*first)] |= position_indicator;

                        ++first;
                        position_indicator = left_shift(position_indicator, 1u);
                        ++elements_count;
                    }

                    m_sequence_length = elements_count;
                }